

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser_error parse_room_tval(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  char *name;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    name = parser_getsym(p,"tval");
    wVar1 = tval_find_idx(name);
    if (wVar1 < L'\0') {
      pVar2 = PARSE_ERROR_UNRECOGNISED_TVAL;
    }
    else {
      *(char *)((long)pvVar3 + 0x1e) = (char)wVar1;
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_room_tval(struct parser *p) {
	struct room_template *t = parser_priv(p);
	int tval;

	if (!t)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	tval = tval_find_idx(parser_getsym(p, "tval"));
	if (tval < 0)
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	t->tval = tval;
	return PARSE_ERROR_NONE;
}